

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

int read_restr_substmt(lys_module *module,lys_restr *restr,lyxml_elem *yin,unres_schema *unres)

{
  lyxml_elem *plVar1;
  int iVar2;
  char *pcVar3;
  lyxml_elem *yin_00;
  
  plVar1 = yin->child;
LAB_0012b6a5:
  do {
    while( true ) {
      do {
        yin_00 = plVar1;
        if (yin_00 == (lyxml_elem *)0x0) {
          return 0;
        }
        plVar1 = yin_00->next;
      } while (yin_00->ns == (lyxml_ns *)0x0);
      iVar2 = strcmp(yin_00->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
      if (iVar2 == 0) break;
      iVar2 = lyp_yin_parse_subnode_ext
                        (module,restr,LYEXT_PAR_RESTR,yin_00,LYEXT_SUBSTMT_SELF,'\0',unres);
      if (iVar2 != 0) {
        return 1;
      }
    }
    pcVar3 = yin_00->name;
    iVar2 = strcmp(pcVar3,"description");
    if (iVar2 == 0) {
      if (restr->dsc != (char *)0x0) goto LAB_0012b8d9;
      iVar2 = lyp_yin_parse_subnode_ext
                        (module,restr,LYEXT_PAR_RESTR,yin_00,LYEXT_SUBSTMT_DESCRIPTION,'\0',unres);
      if (iVar2 != 0) {
        return 1;
      }
      pcVar3 = read_yin_subnode(module->ctx,yin_00,"text");
      restr->dsc = pcVar3;
    }
    else {
      iVar2 = strcmp(pcVar3,"reference");
      if (iVar2 == 0) {
        if (restr->ref != (char *)0x0) goto LAB_0012b8d9;
        iVar2 = lyp_yin_parse_subnode_ext
                          (module,restr,LYEXT_PAR_RESTR,yin_00,LYEXT_SUBSTMT_REFERENCE,'\0',unres);
        if (iVar2 != 0) {
          return 1;
        }
        pcVar3 = read_yin_subnode(module->ctx,yin_00,"text");
        restr->ref = pcVar3;
      }
      else {
        iVar2 = strcmp(pcVar3,"error-app-tag");
        if (iVar2 == 0) {
          if (restr->eapptag != (char *)0x0) {
LAB_0012b8d9:
            ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,pcVar3,yin->name);
            return 1;
          }
          iVar2 = lyp_yin_parse_subnode_ext
                            (module,restr,LYEXT_PAR_RESTR,yin_00,LYEXT_SUBSTMT_ERRTAG,'\0',unres);
          if (iVar2 != 0) {
            return 1;
          }
          pcVar3 = lyxml_get_attr(yin_00,"value",(char *)0x0);
          if (pcVar3 == (char *)0x0) {
            ly_vlog(LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",yin_00->name);
            return 1;
          }
          pcVar3 = lydict_insert(module->ctx,pcVar3,0);
          restr->eapptag = pcVar3;
          goto LAB_0012b6a5;
        }
        iVar2 = strcmp(pcVar3,"error-message");
        if (iVar2 != 0) {
          ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,pcVar3);
          return 1;
        }
        if (restr->emsg != (char *)0x0) goto LAB_0012b8d9;
        iVar2 = lyp_yin_parse_subnode_ext
                          (module,restr,LYEXT_PAR_RESTR,yin_00,LYEXT_SUBSTMT_ERRMSG,'\0',unres);
        if (iVar2 != 0) {
          return 1;
        }
        pcVar3 = read_yin_subnode(module->ctx,yin_00,"value");
        restr->emsg = pcVar3;
      }
    }
    if (pcVar3 == (char *)0x0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
read_restr_substmt(struct lys_module *module, struct lys_restr *restr, struct lyxml_elem *yin,
                   struct unres_schema *unres)
{
    struct lyxml_elem *child, *next;
    const char *value;

    LY_TREE_FOR_SAFE(yin->child, next, child) {
        if (!child->ns) {
            /* garbage */
            continue;
        } else if (strcmp(child->ns->value, LY_NSYIN)) {
            /* extension */
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_SELF, 0, unres)) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "description")) {
            if (restr->dsc) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_DESCRIPTION, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->dsc = read_yin_subnode(module->ctx, child, "text");
            if (!restr->dsc) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "reference")) {
            if (restr->ref) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_REFERENCE, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->ref = read_yin_subnode(module->ctx, child, "text");
            if (!restr->ref) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "error-app-tag")) {
            if (restr->eapptag) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_ERRTAG, 0, unres)) {
                return EXIT_FAILURE;
            }
            GETVAL(value, child, "value");
            restr->eapptag = lydict_insert(module->ctx, value, 0);
        } else if (!strcmp(child->name, "error-message")) {
            if (restr->emsg) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_ERRMSG, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->emsg = read_yin_subnode(module->ctx, child, "value");
            if (!restr->emsg) {
                return EXIT_FAILURE;
            }
        } else {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, child->name);
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}